

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

void __thiscall
robin_hood::detail::
Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
::clear(Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
        *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  size_t __n;
  uint8_t *__s;
  ulong uVar4;
  Destroyer<robin_hood::detail::Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>,_false>
  local_11;
  
  if (this->mNumElements != 0) {
    Destroyer<robin_hood::detail::Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>,_false>
    ::nodes(&local_11,this);
    uVar2 = this->mMask + 1;
    if (uVar2 < 0x28f5c28f5c28f5d) {
      uVar3 = (uVar2 * 0x50) / 100;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar2 >> 2;
      uVar3 = (SUB168(auVar1 * ZEXT816(0x28f5c28f5c28f5c3),8) & 0x3ffffffffffffffc) * 0x14;
    }
    uVar4 = 0xff;
    if (uVar3 < 0xff) {
      uVar4 = uVar3;
    }
    __s = this->mInfo;
    __n = uVar4 + uVar2 + 8;
    if (__n != 0) {
      memset(__s,0,__n);
      __s = this->mInfo;
    }
    __s[uVar4 + uVar2] = '\x01';
    this->mInfoInc = 0x20;
    this->mInfoHashShift = 0;
  }
  return;
}

Assistant:

bool empty() const noexcept {
        ROBIN_HOOD_TRACE(this)
        return 0 == mNumElements;
    }